

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.cpp
# Opt level: O0

int __thiscall
btPersistentManifold::addManifoldPoint
          (btPersistentManifold *this,btManifoldPoint *newPoint,bool isPredictive)

{
  void *in_RSI;
  btPersistentManifold *in_RDI;
  int insertIndex;
  btManifoldPoint *in_stack_000000c8;
  btPersistentManifold *in_stack_000000d0;
  btManifoldPoint *in_stack_ffffffffffffffd8;
  int local_18;
  
  local_18 = getNumContacts(in_RDI);
  if (local_18 == 4) {
    local_18 = sortCachedPoints(in_stack_000000d0,in_stack_000000c8);
    clearUserCache(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    in_RDI->m_cachedPoints = in_RDI->m_cachedPoints + 1;
  }
  if (local_18 < 0) {
    local_18 = 0;
  }
  memcpy(in_RDI->m_pointCache + local_18,in_RSI,0xbc);
  return local_18;
}

Assistant:

int btPersistentManifold::addManifoldPoint(const btManifoldPoint& newPoint, bool isPredictive)
{
	if (!isPredictive)
	{
		btAssert(validContactDistance(newPoint));
	}
	
	int insertIndex = getNumContacts();
	if (insertIndex == MANIFOLD_CACHE_SIZE)
	{
#if MANIFOLD_CACHE_SIZE >= 4
		//sort cache so best points come first, based on area
		insertIndex = sortCachedPoints(newPoint);
#else
		insertIndex = 0;
#endif
		clearUserCache(m_pointCache[insertIndex]);
		
	} else
	{
		m_cachedPoints++;

		
	}
	if (insertIndex<0)
		insertIndex=0;

	btAssert(m_pointCache[insertIndex].m_userPersistentData==0);
	m_pointCache[insertIndex] = newPoint;
	return insertIndex;
}